

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O0

float GEN_CS::safe_probability(float prob)

{
  ostream *poVar1;
  float in_XMM0_Da;
  float local_4;
  
  local_4 = in_XMM0_Da;
  if (in_XMM0_Da <= 0.0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Probability ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM0_Da);
    poVar1 = std::operator<<(poVar1," is not possible, replacing with 1e-3.  Fix your dataset. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 0.001;
  }
  return local_4;
}

Assistant:

float safe_probability(float prob)
{
  if (prob <= 0.)
  {
    std::cout << "Probability " << prob << " is not possible, replacing with 1e-3.  Fix your dataset. " << std::endl;
    return 1e-3f;
  }
  else
    return prob;
}